

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_avx2.c
# Opt level: O2

void av1_dist_wtd_convolve_x_avx2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  longlong *plVar1;
  __m256i *palVar2;
  __m256i data;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  __m256i *extraout_RDX;
  __m256i *extraout_RDX_00;
  __m256i *palVar15;
  __m256i *palVar16;
  CONV_BUF_TYPE *pCVar17;
  long lVar18;
  char cVar19;
  int iVar20;
  long lVar21;
  uint8_t *puVar22;
  CONV_BUF_TYPE *pCVar23;
  uint8_t *puVar24;
  long lVar25;
  long lVar26;
  uint8_t *puVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined2 uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  __m256i data_ref_0;
  __m256i res_unsigned;
  __m256i wt;
  __m256i coeffs [4];
  __m256i filt [4];
  undefined4 uVar38;
  undefined4 uVar39;
  int iVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  int use_dist_wtd_comp_avg;
  uint8_t *local_318;
  undefined2 local_2e0;
  undefined2 uStack_2de;
  short sStack_2dc;
  undefined2 uStack_2da;
  uint8_t *local_2a0;
  undefined1 local_280 [16];
  longlong local_270;
  longlong lStack_268;
  undefined1 local_250 [16];
  undefined2 local_240;
  undefined2 uStack_23e;
  undefined2 uStack_23c;
  undefined2 uStack_23a;
  undefined2 uStack_238;
  undefined2 uStack_236;
  undefined2 uStack_234;
  undefined2 uStack_232;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 uStack_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  ulong local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  __m256i local_1c0;
  undefined2 local_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined2 uStack_198;
  undefined2 uStack_196;
  undefined2 uStack_194;
  undefined2 uStack_192;
  undefined2 uStack_190;
  undefined2 uStack_18e;
  undefined2 uStack_18c;
  undefined2 uStack_18a;
  undefined2 uStack_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  __m256i local_180;
  undefined1 local_160 [2] [16];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  longlong local_e0 [22];
  
  pCVar23 = conv_params->dst;
  lVar21 = (long)conv_params->dst_stride;
  uVar11 = 7 - conv_params->round_1;
  uVar33 = (undefined2)conv_params->fwd_offset;
  auVar29._2_2_ = uVar33;
  auVar29._0_2_ = uVar33;
  auVar29._4_2_ = uVar33;
  auVar29._6_2_ = uVar33;
  auVar29._8_2_ = uVar33;
  auVar29._10_2_ = uVar33;
  auVar29._12_2_ = uVar33;
  auVar29._14_2_ = uVar33;
  auVar29._16_2_ = uVar33;
  auVar29._18_2_ = uVar33;
  auVar29._20_2_ = uVar33;
  auVar29._22_2_ = uVar33;
  auVar29._24_2_ = uVar33;
  auVar29._26_2_ = uVar33;
  auVar29._28_2_ = uVar33;
  auVar29._30_2_ = uVar33;
  uVar33 = (undefined2)conv_params->bck_offset;
  auVar34._2_2_ = uVar33;
  auVar34._0_2_ = uVar33;
  auVar34._4_2_ = uVar33;
  auVar34._6_2_ = uVar33;
  auVar34._8_2_ = uVar33;
  auVar34._10_2_ = uVar33;
  auVar34._12_2_ = uVar33;
  auVar34._14_2_ = uVar33;
  auVar34._16_2_ = uVar33;
  auVar34._18_2_ = uVar33;
  auVar34._20_2_ = uVar33;
  auVar34._22_2_ = uVar33;
  auVar34._24_2_ = uVar33;
  auVar34._26_2_ = uVar33;
  auVar34._28_2_ = uVar33;
  auVar34._30_2_ = uVar33;
  local_180 = (__m256i)vpunpcklwd_avx2(auVar29,auVar34);
  iVar20 = conv_params->round_1 + conv_params->round_0;
  cVar19 = (char)iVar20;
  uVar14 = 0xe - iVar20;
  uVar12 = conv_params->round_0 - 1;
  local_250 = ZEXT416(uVar12);
  iVar20 = conv_params->do_average;
  use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  local_240 = (undefined2)((1 << (0x15U - cVar19 & 0x1f)) + (1 << (0x16U - cVar19 & 0x1f)));
  uVar33 = (undefined2)((uint)(1 << ((byte)uVar14 & 0x1f)) >> 1);
  local_1a0 = (undefined2)((uint)(1 << ((byte)uVar12 & 0x1f)) >> 1);
  local_e0[0] = 0x403030202010100;
  local_e0[1] = 0x807070606050504;
  local_e0[2] = 0x403030202010100;
  local_e0[3] = 0x807070606050504;
  local_e0[4] = 0x605050404030302;
  local_e0[5] = 0xa09090808070706;
  local_e0[6] = 0x605050404030302;
  local_e0[7] = 0xa09090808070706;
  uStack_23e = local_240;
  uStack_23c = local_240;
  uStack_23a = local_240;
  uStack_238 = local_240;
  uStack_236 = local_240;
  uStack_234 = local_240;
  uStack_232 = local_240;
  uStack_230 = local_240;
  uStack_22e = local_240;
  uStack_22c = local_240;
  uStack_22a = local_240;
  uStack_228 = local_240;
  uStack_226 = local_240;
  uStack_224 = local_240;
  uStack_222 = local_240;
  uStack_19e = local_1a0;
  uStack_19c = local_1a0;
  uStack_19a = local_1a0;
  uStack_198 = local_1a0;
  uStack_196 = local_1a0;
  uStack_194 = local_1a0;
  uStack_192 = local_1a0;
  uStack_190 = local_1a0;
  uStack_18e = local_1a0;
  uStack_18c = local_1a0;
  uStack_18a = local_1a0;
  uStack_188 = local_1a0;
  uStack_186 = local_1a0;
  uStack_184 = local_1a0;
  uStack_182 = local_1a0;
  prepare_coeffs_lowbd(filter_params_x,subpel_x_qn,(__m256i *)local_160);
  auVar31._2_2_ = uStack_23e;
  auVar31._0_2_ = local_240;
  auVar31._4_2_ = uStack_23c;
  auVar31._6_2_ = uStack_23a;
  auVar31._8_2_ = uStack_238;
  auVar31._10_2_ = uStack_236;
  auVar31._12_2_ = uStack_234;
  auVar31._14_2_ = uStack_232;
  auVar31._16_2_ = uStack_230;
  auVar31._18_2_ = uStack_22e;
  auVar31._20_2_ = uStack_22c;
  auVar31._22_2_ = uStack_22a;
  auVar31._24_2_ = uStack_228;
  auVar31._26_2_ = uStack_226;
  auVar31._28_2_ = uStack_224;
  auVar31._30_2_ = uStack_222;
  auVar35 = ZEXT3264(auVar31);
  auVar28 = vpor_avx(local_100,local_160[0]);
  if (auVar28._0_4_ == 0) {
    local_1e0 = local_140;
    uStack_1d8 = uStack_138;
    uStack_1d0 = uStack_130;
    uStack_1c8 = uStack_128;
    auVar4._2_2_ = uVar33;
    auVar4._0_2_ = uVar33;
    auVar4._4_2_ = uVar33;
    auVar4._6_2_ = uVar33;
    auVar4._8_2_ = uVar33;
    auVar4._10_2_ = uVar33;
    auVar4._12_2_ = uVar33;
    auVar4._14_2_ = uVar33;
    auVar4._16_2_ = uVar33;
    auVar4._18_2_ = uVar33;
    auVar4._20_2_ = uVar33;
    auVar4._22_2_ = uVar33;
    auVar4._24_2_ = uVar33;
    auVar4._26_2_ = uVar33;
    auVar4._28_2_ = uVar33;
    auVar4._30_2_ = uVar33;
    local_220 = vpsubw_avx2(auVar4,auVar31);
    iVar40 = h >> 0x1f;
    puVar27 = dst0 + dst_stride0;
    pCVar17 = pCVar23 + lVar21;
    local_2e0 = SUB82(pCVar17,0);
    uStack_2de = (undefined2)((ulong)pCVar17 >> 0x10);
    sStack_2dc = (short)((ulong)pCVar17 >> 0x20);
    uStack_2da = (undefined2)((ulong)pCVar17 >> 0x30);
    uVar41 = (undefined4)(lVar21 << 2);
    uVar42 = (undefined4)((ulong)(lVar21 << 2) >> 0x20);
    puVar24 = src + (long)src_stride + -1;
    puVar22 = src + -1;
    lVar21 = (long)src_stride * 2;
    lVar25 = (long)dst_stride0 * 2;
    local_200._0_16_ = ZEXT416(uVar11);
    auVar36 = ZEXT3264(CONCAT1616(_DAT_00468e20,_DAT_00468e20));
    auVar37 = ZEXT3264(CONCAT1616(_DAT_00468a00,_DAT_00468a00));
    for (lVar18 = 0; lVar18 < CONCAT44(iVar40,h); lVar18 = lVar18 + 2) {
      for (lVar26 = 0; lVar26 < w; lVar26 = lVar26 + 8) {
        auVar32._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(puVar24 + lVar26) +
             ZEXT116(1) * *(undefined1 (*) [16])(puVar22 + lVar26);
        auVar32._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(puVar24 + lVar26);
        auVar31 = vpshufb_avx2(auVar32,auVar36._0_32_);
        auVar8._8_8_ = uStack_1d8;
        auVar8._0_8_ = local_1e0;
        auVar8._16_8_ = uStack_1d0;
        auVar8._24_8_ = uStack_1c8;
        auVar31 = vpmaddubsw_avx2(auVar31,auVar8);
        auVar29 = vpshufb_avx2(auVar32,auVar37._0_32_);
        auVar5._8_8_ = uStack_118;
        auVar5._0_8_ = local_120;
        auVar5._16_8_ = uStack_110;
        auVar5._24_8_ = uStack_108;
        auVar29 = vpmaddubsw_avx2(auVar29,auVar5);
        auVar10._2_2_ = uStack_19e;
        auVar10._0_2_ = local_1a0;
        auVar10._4_2_ = uStack_19c;
        auVar10._6_2_ = uStack_19a;
        auVar10._8_2_ = uStack_198;
        auVar10._10_2_ = uStack_196;
        auVar10._12_2_ = uStack_194;
        auVar10._14_2_ = uStack_192;
        auVar10._16_2_ = uStack_190;
        auVar10._18_2_ = uStack_18e;
        auVar10._20_2_ = uStack_18c;
        auVar10._22_2_ = uStack_18a;
        auVar10._24_2_ = uStack_188;
        auVar10._26_2_ = uStack_186;
        auVar10._28_2_ = uStack_184;
        auVar10._30_2_ = uStack_182;
        auVar31 = vpaddw_avx2(auVar31,auVar10);
        auVar31 = vpaddw_avx2(auVar31,auVar29);
        auVar31 = vpsraw_avx2(auVar31,local_250);
        auVar31 = vpsllw_avx2(auVar31,local_200._0_16_);
        local_1c0 = (__m256i)vpaddw_avx2(auVar31,auVar35._0_32_);
        if (iVar20 == 0) {
          *(undefined1 (*) [16])(pCVar23 + lVar26) = local_1c0._0_16_;
          *(undefined1 (*) [16])
           (CONCAT26(uStack_2da,CONCAT24(sStack_2dc,CONCAT22(uStack_2de,local_2e0))) + lVar26 * 2) =
               local_1c0._16_16_;
        }
        else {
          local_280 = *(undefined1 (*) [16])(pCVar23 + lVar26);
          auVar31 = ZEXT1632(local_280);
          plVar1 = (longlong *)
                   (CONCAT26(uStack_2da,CONCAT24(sStack_2dc,CONCAT22(uStack_2de,local_2e0))) +
                   lVar26 * 2);
          local_270 = *plVar1;
          lStack_268 = plVar1[1];
          comp_avg((__m256i *)local_280,&local_1c0,&local_180,use_dist_wtd_comp_avg);
          auVar31 = vpaddw_avx2(auVar31,local_220);
          auVar31 = vpsraw_avx2(auVar31,ZEXT416(uVar14));
          auVar31 = vpackuswb_avx2(auVar31,auVar31);
          if (w < 5) {
            *(int *)(dst0 + lVar26) = auVar31._0_4_;
            *(int *)(puVar27 + lVar26) = auVar31._16_4_;
          }
          else {
            *(long *)(dst0 + lVar26) = auVar31._0_8_;
            *(long *)(puVar27 + lVar26) = auVar31._16_8_;
          }
          auVar35 = ZEXT3264(CONCAT230(uStack_222,
                                       CONCAT228(uStack_224,
                                                 CONCAT226(uStack_226,
                                                           CONCAT224(uStack_228,
                                                                     CONCAT222(uStack_22a,
                                                                               CONCAT220(uStack_22c,
                                                                                         CONCAT218(
                                                  uStack_22e,
                                                  CONCAT216(uStack_230,
                                                            CONCAT214(uStack_232,
                                                                      CONCAT212(uStack_234,
                                                                                CONCAT210(uStack_236
                                                                                          ,CONCAT28(
                                                  uStack_238,
                                                  CONCAT26(uStack_23a,
                                                           CONCAT24(uStack_23c,
                                                                    CONCAT22(uStack_23e,local_240)))
                                                  )))))))))))));
          auVar36 = ZEXT3264(CONCAT1616(_DAT_00468e20,_DAT_00468e20));
          auVar37 = ZEXT3264(CONCAT1616(_DAT_00468a00,_DAT_00468a00));
        }
      }
      lVar26 = CONCAT26(uStack_2da,CONCAT24(sStack_2dc,CONCAT22(uStack_2de,local_2e0))) +
               CONCAT44(uVar42,uVar41);
      local_2e0 = (undefined2)lVar26;
      uStack_2de = (undefined2)((ulong)lVar26 >> 0x10);
      sStack_2dc = (short)((ulong)lVar26 >> 0x20);
      uStack_2da = (undefined2)((ulong)lVar26 >> 0x30);
      puVar24 = puVar24 + lVar21;
      pCVar23 = (CONV_BUF_TYPE *)((long)pCVar23 + CONCAT44(uVar42,uVar41));
      puVar22 = puVar22 + lVar21;
      puVar27 = puVar27 + lVar25;
      dst0 = dst0 + lVar25;
    }
  }
  else {
    uVar13 = (ulong)(filter_params_x->taps >> 1);
    local_318 = src + (1 - uVar13);
    local_e0[8] = 0x807070606050504;
    local_e0[9] = 0xc0b0b0a0a090908;
    local_e0[10] = 0x807070606050504;
    local_e0[0xb] = 0xc0b0b0a0a090908;
    local_e0[0xc] = 0xa09090808070706;
    local_e0[0xd] = 0xe0d0d0c0c0b0b0a;
    local_e0[0xe] = 0xa09090808070706;
    local_e0[0xf] = 0xe0d0d0c0c0b0b0a;
    auVar3._2_2_ = uVar33;
    auVar3._0_2_ = uVar33;
    auVar3._4_2_ = uVar33;
    auVar3._6_2_ = uVar33;
    auVar3._8_2_ = uVar33;
    auVar3._10_2_ = uVar33;
    auVar3._12_2_ = uVar33;
    auVar3._14_2_ = uVar33;
    auVar3._16_2_ = uVar33;
    auVar3._18_2_ = uVar33;
    auVar3._20_2_ = uVar33;
    auVar3._22_2_ = uVar33;
    auVar3._24_2_ = uVar33;
    auVar3._26_2_ = uVar33;
    auVar3._28_2_ = uVar33;
    auVar3._30_2_ = uVar33;
    local_200 = vpsubw_avx2(auVar3,auVar31);
    sStack_2dc = (short)(w >> 0x1f);
    local_220._0_8_ = (long)h;
    local_2a0 = dst0 + dst_stride0;
    pCVar17 = pCVar23 + lVar21;
    uVar41 = (undefined4)(lVar21 << 2);
    uVar42 = (undefined4)((ulong)(lVar21 << 2) >> 0x20);
    puVar27 = src + ((long)src_stride - uVar13) + 1;
    lVar21 = (long)src_stride * 2;
    palVar2 = (__m256i *)((long)dst_stride0 * 2);
    local_1e0 = (ulong)uVar11;
    uStack_1d8 = 0;
    auVar28 = ZEXT416(uVar14);
    palVar16 = (__m256i *)0x0;
    palVar15 = palVar2;
    while ((long)palVar16 < (long)local_220._0_8_) {
      uVar38 = SUB84(palVar16,0);
      uVar39 = (undefined4)((ulong)palVar16 >> 0x20);
      lVar25 = 0;
      while( true ) {
        if (CONCAT26(sStack_2dc,(int6)w) <= lVar25) break;
        auVar30._0_16_ =
             ZEXT116(0) * *(undefined1 (*) [16])(puVar27 + lVar25) +
             ZEXT116(1) * *(undefined1 (*) [16])(local_318 + lVar25);
        auVar30._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
             ZEXT116(1) * *(undefined1 (*) [16])(puVar27 + lVar25);
        data[0]._4_4_ = uVar39;
        data[0]._0_4_ = uVar38;
        data[1]._0_4_ = (int)lVar21;
        data[1]._4_4_ = (int)((ulong)lVar21 >> 0x20);
        data[2]._0_4_ = uVar41;
        data[2]._4_4_ = uVar42;
        data[3]._0_4_ = uVar14;
        data[3]._4_4_ = use_dist_wtd_comp_avg;
        convolve_lowbd_x((__m256i *)local_160,data,(__m256i *)local_e0,palVar15);
        auVar9._2_2_ = uStack_19e;
        auVar9._0_2_ = local_1a0;
        auVar9._4_2_ = uStack_19c;
        auVar9._6_2_ = uStack_19a;
        auVar9._8_2_ = uStack_198;
        auVar9._10_2_ = uStack_196;
        auVar9._12_2_ = uStack_194;
        auVar9._14_2_ = uStack_192;
        auVar9._16_2_ = uStack_190;
        auVar9._18_2_ = uStack_18e;
        auVar9._20_2_ = uStack_18c;
        auVar9._22_2_ = uStack_18a;
        auVar9._24_2_ = uStack_188;
        auVar9._26_2_ = uStack_186;
        auVar9._28_2_ = uStack_184;
        auVar9._30_2_ = uStack_182;
        auVar31 = vpaddw_avx2(auVar30,auVar9);
        auVar31 = vpsraw_avx2(auVar31,local_250);
        auVar7._8_8_ = uStack_1d8;
        auVar7._0_8_ = local_1e0;
        auVar31 = vpsllw_avx2(auVar31,auVar7);
        auVar6._2_2_ = uStack_23e;
        auVar6._0_2_ = local_240;
        auVar6._4_2_ = uStack_23c;
        auVar6._6_2_ = uStack_23a;
        auVar6._8_2_ = uStack_238;
        auVar6._10_2_ = uStack_236;
        auVar6._12_2_ = uStack_234;
        auVar6._14_2_ = uStack_232;
        auVar6._16_2_ = uStack_230;
        auVar6._18_2_ = uStack_22e;
        auVar6._20_2_ = uStack_22c;
        auVar6._22_2_ = uStack_22a;
        auVar6._24_2_ = uStack_228;
        auVar6._26_2_ = uStack_226;
        auVar6._28_2_ = uStack_224;
        auVar6._30_2_ = uStack_222;
        local_1c0 = (__m256i)vpaddw_avx2(auVar31,auVar6);
        if (iVar20 == 0) {
          *(undefined1 (*) [16])(pCVar23 + lVar25) = local_1c0._0_16_;
          *(undefined1 (*) [16])(pCVar17 + lVar25) = local_1c0._16_16_;
          palVar15 = extraout_RDX;
        }
        else {
          local_280 = *(undefined1 (*) [16])(pCVar23 + lVar25);
          auVar31 = ZEXT1632(local_280);
          local_270 = *(longlong *)(pCVar17 + lVar25);
          lStack_268 = *(longlong *)(pCVar17 + lVar25 + 4);
          comp_avg((__m256i *)local_280,&local_1c0,&local_180,use_dist_wtd_comp_avg);
          auVar31 = vpaddw_avx2(auVar31,local_200);
          auVar31 = vpsraw_avx2(auVar31,auVar28);
          auVar31 = vpackuswb_avx2(auVar31,auVar31);
          palVar15 = extraout_RDX_00;
          if (w < 5) {
            *(int *)(dst0 + lVar25) = auVar31._0_4_;
            *(int *)(local_2a0 + lVar25) = auVar31._16_4_;
          }
          else {
            *(long *)(dst0 + lVar25) = auVar31._0_8_;
            *(long *)(local_2a0 + lVar25) = auVar31._16_8_;
          }
        }
        lVar25 = lVar25 + 8;
      }
      pCVar17 = (CONV_BUF_TYPE *)((long)pCVar17 + CONCAT44(uVar42,uVar41));
      puVar27 = puVar27 + lVar21;
      pCVar23 = (CONV_BUF_TYPE *)((long)pCVar23 + CONCAT44(uVar42,uVar41));
      local_318 = local_318 + lVar21;
      local_2a0 = local_2a0 + (long)palVar2;
      dst0 = dst0 + (long)palVar2;
      palVar16 = (__m256i *)(CONCAT44(uVar39,uVar38) + 2);
      palVar15 = palVar16;
    }
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_x_avx2(const uint8_t *src, int src_stride,
                                  uint8_t *dst0, int dst_stride0, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const int subpel_x_qn,
                                  ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;
  int i, j, is_horiz_4tap = 0;
  const int bits = FILTER_BITS - conv_params->round_1;
  const __m256i wt = unpack_weights_avx2(conv_params);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi16((1 << rounding_shift) >> 1);

  assert(bits >= 0);
  assert(conv_params->round_0 > 0);

  const __m256i round_const =
      _mm256_set1_epi16((1 << (conv_params->round_0 - 1)) >> 1);
  const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0 - 1);

  __m256i filt[4], coeffs[4];

  filt[0] = _mm256_load_si256((__m256i const *)filt_global_avx2);
  filt[1] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32));

  prepare_coeffs_lowbd(filter_params_x, subpel_x_qn, coeffs);

  // Condition for checking valid horz_filt taps
  if (!(_mm256_extract_epi32(_mm256_or_si256(coeffs[0], coeffs[3]), 0)))
    is_horiz_4tap = 1;

  // horz_filt as 4 tap
  if (is_horiz_4tap) {
    const int fo_horiz = 1;
    const uint8_t *const src_ptr = src - fo_horiz;
    for (i = 0; i < h; i += 2) {
      const uint8_t *src_data = src_ptr + i * src_stride;
      CONV_BUF_TYPE *dst_data = dst + i * dst_stride;
      for (j = 0; j < w; j += 8) {
        const __m256i data =
            load_line2_avx2(&src_data[j], &src_data[j + src_stride]);

        __m256i res = convolve_lowbd_x_4tap(data, coeffs + 1, filt);
        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const), round_shift);
        res = _mm256_slli_epi16(res, bits);

        const __m256i res_unsigned = _mm256_add_epi16(res, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m256i data_ref_0 =
              load_line2_avx2(&dst_data[j], &dst_data[j + dst_stride]);
          const __m256i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m256i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_8 = _mm256_packus_epi16(round_result, round_result);
          const __m128i res_0 = _mm256_castsi256_si128(res_8);
          const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

          if (w > 4) {
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);
          }
        } else {
          const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

          const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  } else {
    const int fo_horiz = filter_params_x->taps / 2 - 1;
    const uint8_t *const src_ptr = src - fo_horiz;

    filt[2] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 2));
    filt[3] = _mm256_load_si256((__m256i const *)(filt_global_avx2 + 32 * 3));
    for (i = 0; i < h; i += 2) {
      const uint8_t *src_data = src_ptr + i * src_stride;
      CONV_BUF_TYPE *dst_data = dst + i * dst_stride;
      for (j = 0; j < w; j += 8) {
        const __m256i data =
            load_line2_avx2(&src_data[j], &src_data[j + src_stride]);

        __m256i res = convolve_lowbd_x(data, coeffs, filt);

        res = _mm256_sra_epi16(_mm256_add_epi16(res, round_const), round_shift);

        res = _mm256_slli_epi16(res, bits);

        const __m256i res_unsigned = _mm256_add_epi16(res, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m256i data_ref_0 =
              load_line2_avx2(&dst_data[j], &dst_data[j + dst_stride]);
          const __m256i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m256i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_8 = _mm256_packus_epi16(round_result, round_result);
          const __m128i res_0 = _mm256_castsi256_si128(res_8);
          const __m128i res_1 = _mm256_extracti128_si256(res_8, 1);

          if (w > 4) {
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)((&dst0[i * dst_stride0 + j + dst_stride0])), res_1);
          } else {
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_0);
            *(int *)(&dst0[i * dst_stride0 + j + dst_stride0]) =
                _mm_cvtsi128_si32(res_1);
          }
        } else {
          const __m128i res_0 = _mm256_castsi256_si128(res_unsigned);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);

          const __m128i res_1 = _mm256_extracti128_si256(res_unsigned, 1);
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                          res_1);
        }
      }
    }
  }
}